

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O2

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_153<slang::SmallVector<int,_3UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_153<slang::SmallVector<int,_3UL>_>_>
         *this)

{
  code *pcVar1;
  char *pcVar2;
  EVP_PKEY_CTX *in_RSI;
  CATCH2_INTERNAL_TEMPLATE_TEST_153<slang::SmallVector<int,_3UL>_> obj;
  SmallVectorReferenceInvalidationTest<slang::SmallVector<int,_3UL>_> SStack_38;
  
  anon_unknown.dwarf_965823::SmallVectorReferenceInvalidationTest<slang::SmallVector<int,_3UL>_>::
  SmallVectorReferenceInvalidationTest(&SStack_38);
  pcVar1 = (code *)this->m_testAsMethod;
  pcVar2 = SStack_38.v.super_SmallVectorBase<int>.firstElement + *(long *)&this->field_0x10 + -0x18;
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)pcVar2 + -1);
  }
  (*pcVar1)(pcVar2);
  slang::SmallVectorBase<int>::cleanup((SmallVectorBase<int> *)&SStack_38,in_RSI);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }